

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiBroker.cpp
# Opt level: O3

bool __thiscall helics::MultiBroker::brokerConnect(MultiBroker *this)

{
  CoreType CVar1;
  pointer pcVar2;
  CommsInterface *pCVar3;
  undefined8 uVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  Option *pOVar7;
  CoreType CVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  MultiBroker *pMVar10;
  sockaddr *__addr;
  sockaddr *__addr_00;
  ushort uVar11;
  milliseconds mVar12;
  bool bVar13;
  string_view localAddress;
  string_view name;
  string_view name_00;
  string localConfigString;
  ostringstream oss;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_3c0;
  undefined1 local_3b0 [72];
  function<void_(helics::ActionMessage_&&)> local_368;
  vector<std::unique_ptr<helics::CommsInterface,std::default_delete<helics::CommsInterface>>,std::allocator<std::unique_ptr<helics::CommsInterface,std::default_delete<helics::CommsInterface>>>>
  *local_348;
  _Any_data local_340;
  CoreType *local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_328;
  _Any_data local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_308;
  _Alloc_hider local_300;
  undefined1 local_2f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined4 local_258;
  undefined4 uStack_254;
  int iStack_250;
  int iStack_24c;
  _Invoker_type local_248;
  int iStack_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined3 uStack_234;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230 [5];
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  local_90;
  _Any_data local_70;
  element_type *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8,
                 "--config=\'",&this->configFile);
  pbVar6 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_replace_aux((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_2f8,local_2f8._8_8_,0,1,'\'');
  local_3b0._32_8_ = local_3b0 + 0x30;
  pcVar2 = (pbVar6->_M_dataplus)._M_p;
  paVar9 = &pbVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar9) {
    local_3b0._48_8_ = paVar9->_M_allocated_capacity;
    local_3b0._56_8_ = *(size_type *)((long)&pbVar6->field_2 + 8);
  }
  else {
    local_3b0._48_8_ = paVar9->_M_allocated_capacity;
    local_3b0._32_8_ = pcVar2;
  }
  local_3b0._40_8_ = pbVar6->_M_string_length;
  (pbVar6->_M_dataplus)._M_p = (pointer)paVar9;
  pbVar6->_M_string_length = 0;
  (pbVar6->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._0_8_ != &local_2e8) {
    operator_delete((void *)local_2f8._0_8_,local_2e8._M_allocated_capacity + 1);
  }
  CVar8 = (CoreType)paVar9;
  if ((this->configFile)._M_string_length == 0) {
    if (this->type == MULTI) {
      this->type = DEFAULT;
    }
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    local_3c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_001c0884:
    if ((this->netInfo).brokerAddress._M_string_length == 0 &&
        (this->netInfo).brokerName._M_string_length == 0) {
      CoreBroker::setAsRoot(&this->super_CoreBroker);
    }
    CommFactory::create((CommFactory *)local_2f8,this->type);
    uVar4 = local_2f8._0_8_;
    local_2f8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    pCVar3 = (this->masterComm)._M_t.
             super___uniq_ptr_impl<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::CommsInterface_*,_std::default_delete<helics::CommsInterface>_>
             .super__Head_base<0UL,_helics::CommsInterface_*,_false>._M_head_impl;
    (this->masterComm)._M_t.
    super___uniq_ptr_impl<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>._M_t
    .super__Tuple_impl<0UL,_helics::CommsInterface_*,_std::default_delete<helics::CommsInterface>_>.
    super__Head_base<0UL,_helics::CommsInterface_*,_false>._M_head_impl = (CommsInterface *)uVar4;
    if ((pCVar3 != (CommsInterface *)0x0) &&
       ((*pCVar3->_vptr_CommsInterface[1])(),
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_2f8._0_8_ !=
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0)) {
      (**(code **)(*(size_type *)local_2f8._0_8_ + 8))();
    }
    local_70._8_8_ = (Option *)0x0;
    local_58 = CLI::std::
               _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/MultiBroker.cpp:113:37)>
               ::_M_invoke;
    local_60 = (element_type *)
               CLI::std::
               _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/MultiBroker.cpp:113:37)>
               ::_M_manager;
    local_70._M_unused._M_object = this;
    CommsInterface::setCallback
              ((this->masterComm)._M_t.
               super___uniq_ptr_impl<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::CommsInterface_*,_std::default_delete<helics::CommsInterface>_>
               .super__Head_base<0UL,_helics::CommsInterface_*,_false>._M_head_impl,
               (function<void_(helics::ActionMessage_&&)> *)&local_70);
    if (local_60 != (element_type *)0x0) {
      (*(code *)local_60)(&local_70,&local_70,3);
    }
    pCVar3 = (this->masterComm)._M_t.
             super___uniq_ptr_impl<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::CommsInterface_*,_std::default_delete<helics::CommsInterface>_>
             .super__Head_base<0UL,_helics::CommsInterface_*,_false>._M_head_impl;
    BrokerBase::getLoggingCallback(&(this->super_CoreBroker).super_BrokerBase);
    CommsInterface::setLoggingCallback(pCVar3,&local_90);
    if ((pointer)local_90.super__Function_base._M_manager != (pointer)0x0) {
      (*local_90.super__Function_base._M_manager)(&local_90,&local_90,3);
    }
    CommsInterface::setName
              ((this->masterComm)._M_t.
               super___uniq_ptr_impl<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::CommsInterface_*,_std::default_delete<helics::CommsInterface>_>
               .super__Head_base<0UL,_helics::CommsInterface_*,_false>._M_head_impl,
               (string *)&(this->super_CoreBroker).super_BrokerBase.identifier);
    pCVar3 = (this->masterComm)._M_t.
             super___uniq_ptr_impl<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::CommsInterface_*,_std::default_delete<helics::CommsInterface>_>
             .super__Head_base<0UL,_helics::CommsInterface_*,_false>._M_head_impl;
    (*pCVar3->_vptr_CommsInterface[2])(pCVar3,&this->netInfo);
    mVar12.__r = (this->super_CoreBroker).super_BrokerBase.networkTimeout.internalTimeCode / 1000000
    ;
    CommsInterface::setTimeout
              ((this->masterComm)._M_t.
               super___uniq_ptr_impl<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::CommsInterface_*,_std::default_delete<helics::CommsInterface>_>
               .super__Head_base<0UL,_helics::CommsInterface_*,_false>._M_head_impl,mVar12);
    iVar5 = CommsInterface::connect
                      ((this->masterComm)._M_t.
                       super___uniq_ptr_impl<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::CommsInterface_*,_std::default_delete<helics::CommsInterface>_>
                       .super__Head_base<0UL,_helics::CommsInterface_*,_false>._M_head_impl,
                       (int)mVar12.__r,__addr,CVar8);
    if ((char)iVar5 == '\0') {
      bVar13 = false;
      goto LAB_001c1568;
    }
    name._M_str._0_4_ = this->type;
    name._M_len = (size_t)(this->super_CoreBroker).super_BrokerBase.identifier._M_dataplus._M_p;
    name._M_str._4_4_ = 0;
    BrokerFactory::addAssociatedBrokerType
              ((BrokerFactory *)
               (this->super_CoreBroker).super_BrokerBase.identifier._M_string_length,name,CVar8);
  }
  else {
    CVar8 = 0x459a74;
    localAddress._M_str = (char *)0x0;
    localAddress._M_len = (size_t)&this->netInfo;
    NetworkBrokerData::commandLineParser((NetworkBrokerData *)local_2f8,localAddress,true);
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_2f8._0_8_;
    local_3c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._8_8_;
    helicsCLI11App::addTypeOption((helicsCLI11App *)local_2f8._0_8_,true);
    paVar9->_M_local_buf[0x49] = '\0';
    if (this->type != MULTI) goto LAB_001c0884;
    CLI::App::get_config_formatter_base((App *)local_3b0);
    uVar4 = local_3b0._0_8_;
    local_2f8._0_8_ = &local_2e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"master","");
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar4 + 0x30),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._0_8_ != &local_2e8) {
      operator_delete((void *)local_2f8._0_8_,local_2e8._M_allocated_capacity + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_);
    }
    *(CoreType *)(paVar9->_M_local_buf + 0x398) = this->type;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,local_3b0._32_8_,(pointer)(local_3b0._40_8_ + local_3b0._32_8_));
    CLI::App::parse((App *)paVar9,&local_c0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    CVar1 = *(CoreType *)(paVar9->_M_local_buf + 0x398);
    this->type = CVar1;
    if (CVar1 != MULTI) goto LAB_001c0884;
  }
  if ((this->configFile)._M_string_length == 0) {
    bVar13 = true;
  }
  else {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"--broker","");
    pOVar7 = CLI::App::get_option((App *)paVar9,&local_e0);
    CLI::App::remove_option((App *)paVar9,pOVar7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"--brokerport","");
    pOVar7 = CLI::App::get_option((App *)paVar9,&local_100);
    CLI::App::remove_option((App *)paVar9,pOVar7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p,
                      (ulong)(local_100.field_2._M_allocated_capacity + 1));
    }
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"--brokername","");
    pOVar7 = CLI::App::get_option((App *)paVar9,&local_120);
    CLI::App::remove_option((App *)paVar9,pOVar7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,
                      (ulong)(local_120.field_2._M_allocated_capacity + 1));
    }
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"--brokeraddress","");
    pOVar7 = CLI::App::get_option((App *)paVar9,&local_140);
    CLI::App::remove_option((App *)paVar9,pOVar7);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,
                      (ulong)(local_140.field_2._M_allocated_capacity + 1));
    }
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"--autobroker","");
    pOVar7 = CLI::App::get_option((App *)paVar9,&local_160);
    CLI::App::remove_option((App *)paVar9,pOVar7);
    local_330 = &this->type;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    local_3b0._64_8_ = &this->netInfo;
    local_300._M_p = (pointer)&(this->netInfo).brokerAddress;
    local_308 = &(this->netInfo).localInterface;
    local_310 = &(this->netInfo).brokerInitString;
    local_320._8_8_ = &(this->netInfo).connectionAddress;
    local_320._M_unused._M_object = &(this->netInfo).portNumber;
    local_328 = &(this->netInfo).encryptionConfig;
    local_340._8_8_ = &(this->super_CoreBroker).super_BrokerBase;
    local_340._M_unused._M_object = &(this->super_CoreBroker).super_BrokerBase.identifier;
    local_348 = (vector<std::unique_ptr<helics::CommsInterface,std::default_delete<helics::CommsInterface>>,std::allocator<std::unique_ptr<helics::CommsInterface,std::default_delete<helics::CommsInterface>>>>
                 *)&this->comms;
    uVar11 = 0;
    do {
      memset(&local_2e8,0,0xe0);
      local_2f8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_2d8.field_2._M_local_buf[0] = '\0';
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      local_2b8.field_2._M_local_buf[0] = '\0';
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      local_298.field_2._M_local_buf[0] = '\0';
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      local_278.field_2._M_local_buf[0] = '\0';
      local_258 = -1;
      uStack_254 = -1;
      iStack_250 = -1;
      iStack_24c = -1;
      local_248 = (_Invoker_type)0x10000001000;
      iStack_240 = 5;
      uStack_23c._0_1_ = LOCAL;
      uStack_23c._1_1_ = false;
      uStack_23c._2_1_ = false;
      uStack_23c._3_1_ = false;
      uStack_238._0_1_ = false;
      uStack_238._1_1_ = false;
      uStack_238._2_1_ = false;
      uStack_238._3_1_ = false;
      uStack_234._0_1_ = UNSPECIFIED;
      uStack_234._1_1_ = false;
      uStack_234._2_1_ = false;
      local_230[0].field_2._M_local_buf[0] = '\0';
      local_230[1]._M_dataplus._M_p._0_1_ = IP;
      local_2f8._0_8_ = &local_2e8;
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      local_230[0]._M_dataplus._M_p = (pointer)&local_230[0].field_2;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_3b0._64_8_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300._M_p,
                &local_2d8);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(local_308,&local_2b8);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(local_310,&local_298);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320._8_8_
                ,&local_278);
      *(ulong *)local_320._M_unused._0_8_ = CONCAT44(uStack_254,local_258);
      *(ulong *)(local_320._M_unused._M_function_pointer + 8) = CONCAT44(iStack_24c,iStack_250);
      *(_Invoker_type *)(local_320._M_unused._M_function_pointer + 0x10) = local_248;
      *(ulong *)(local_320._M_unused._M_function_pointer + 0x18) = CONCAT44(uStack_23c,iStack_240);
      *(ulong *)(local_320._M_unused._M_function_pointer + 0x1f) =
           CONCAT35(uStack_234,CONCAT41(uStack_238,uStack_23c._3_1_));
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(local_328,local_230);
      (this->netInfo).allowedType = local_230[1]._M_dataplus._M_p._0_1_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230[0]._M_dataplus._M_p != &local_230[0].field_2) {
        operator_delete(local_230[0]._M_dataplus._M_p,
                        CONCAT71(local_230[0].field_2._M_allocated_capacity._1_7_,
                                 local_230[0].field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,
                        CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                                 local_278.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,
                        CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                 local_298.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,
                        CONCAT71(local_2b8.field_2._M_allocated_capacity._1_7_,
                                 local_2b8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,
                        CONCAT71(local_2d8.field_2._M_allocated_capacity._1_7_,
                                 local_2d8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._0_8_ != &local_2e8) {
        operator_delete((void *)local_2f8._0_8_,local_2e8._M_allocated_capacity + 1);
      }
      CLI::App::get_config_formatter_base((App *)local_3b0);
      uVar4 = local_3b0._0_8_;
      local_2f8._0_8_ = &local_2e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"comms","");
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar4 + 0x30),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8);
      *(ushort *)(uVar4 + 0x2a) = uVar11;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._0_8_ != &local_2e8) {
        operator_delete((void *)local_2f8._0_8_,local_2e8._M_allocated_capacity + 1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3b0._8_8_);
      }
      *(char *)((long)paVar9 + 0x398) = '-';
      *(char *)((long)paVar9 + 0x399) = '\0';
      *(char *)((long)paVar9 + 0x39a) = '\0';
      *(char *)((long)paVar9 + 0x39b) = '\0';
      local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_180,local_3b0._32_8_,
                 (pointer)(local_3b0._40_8_ + local_3b0._32_8_));
      CLI::App::parse((App *)paVar9,&local_180,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != &local_180.field_2) {
        operator_delete(local_180._M_dataplus._M_p,
                        (ulong)(local_180.field_2._M_allocated_capacity + 1));
      }
      CVar8 = *(CoreType *)(paVar9->_M_local_buf + 0x398);
      *local_330 = CVar8;
      bVar13 = CVar8 == MULTI;
      if (bVar13) break;
      CommFactory::create((CommFactory *)local_2f8,CVar8);
      local_368.super__Function_base._M_functor._10_6_ = 0;
      local_368.super__Function_base._M_functor._8_2_ = uVar11;
      local_368._M_invoker =
           CLI::std::
           _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/MultiBroker.cpp:144:35)>
           ::_M_invoke;
      local_368.super__Function_base._M_manager =
           CLI::std::
           _Function_handler<void_(helics::ActionMessage_&&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/MultiBroker.cpp:144:35)>
           ::_M_manager;
      local_368.super__Function_base._M_functor._M_unused._M_object = this;
      CommsInterface::setCallback((CommsInterface *)local_2f8._0_8_,&local_368);
      if (local_368.super__Function_base._M_manager != (code *)0x0) {
        (*local_368.super__Function_base._M_manager)(&local_368,&local_368,3);
      }
      uVar4 = local_2f8._0_8_;
      BrokerBase::getLoggingCallback((BrokerBase *)local_340._8_8_);
      CommsInterface::setLoggingCallback
                ((CommsInterface *)uVar4,
                 (function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                  *)&local_50);
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      CommsInterface::setName((CommsInterface *)local_2f8._0_8_,(string *)local_340._M_unused._0_8_)
      ;
      (**(code **)(*(size_type *)local_2f8._0_8_ + 0x10))(local_2f8._0_8_,local_3b0._64_8_);
      mVar12.__r = (this->super_CoreBroker).super_BrokerBase.networkTimeout.internalTimeCode /
                   1000000;
      pMVar10 = this;
      CommsInterface::setTimeout((CommsInterface *)local_2f8._0_8_,mVar12);
      CVar8 = (CoreType)pMVar10;
      iVar5 = CommsInterface::connect
                        ((CommsInterface *)local_2f8._0_8_,(int)mVar12.__r,__addr_00,CVar8);
      std::
      vector<std::unique_ptr<helics::CommsInterface,std::default_delete<helics::CommsInterface>>,std::allocator<std::unique_ptr<helics::CommsInterface,std::default_delete<helics::CommsInterface>>>>
      ::
      emplace_back<std::unique_ptr<helics::CommsInterface,std::default_delete<helics::CommsInterface>>>
                (local_348,
                 (unique_ptr<helics::CommsInterface,_std::default_delete<helics::CommsInterface>_> *
                 )local_2f8);
      if ((char)iVar5 == '\0') {
        (*(this->super_CoreBroker).super_Broker._vptr_Broker[0x21])();
      }
      else {
        name_00._M_str._0_4_ = this->type;
        name_00._M_len =
             (size_t)(this->super_CoreBroker).super_BrokerBase.identifier._M_dataplus._M_p;
        name_00._M_str._4_4_ = 0;
        BrokerFactory::addAssociatedBrokerType
                  ((BrokerFactory *)
                   (this->super_CoreBroker).super_BrokerBase.identifier._M_string_length,name_00,
                   CVar8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*(size_type *)local_2f8._0_8_ + 8))();
      }
      uVar11 = uVar11 + 1;
    } while ((char)iVar5 != '\0');
  }
LAB_001c1568:
  if ((undefined1 *)local_3b0._32_8_ != local_3b0 + 0x30) {
    operator_delete((void *)local_3b0._32_8_,local_3b0._48_8_ + 1);
  }
  if (local_3c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3c0);
  }
  return bVar13;
}

Assistant:

bool MultiBroker::brokerConnect()
{
    std::shared_ptr<helicsCLI11App> app;
    const std::string localConfigString = "--config='" + configFile + '\'';
    if (!configFile.empty()) {
        app = netInfo.commandLineParser("");
        app->addTypeOption();
        app->allow_config_extras(CLI::config_extras_mode::error);
    } else if (type == CoreType::MULTI) {
        type = CoreType::DEFAULT;
    }
    try {
        if (type == CoreType::MULTI) {
            app->get_config_formatter_base()->section("master");
            app->setDefaultCoreType(type);
            app->parse(localConfigString);
            type = app->getCoreType();
        }
        if (type != CoreType::MULTI) {
            if ((netInfo.brokerName.empty()) && (netInfo.brokerAddress.empty())) {
                CoreBroker::setAsRoot();
            }
            masterComm = CommFactory::create(type);
            masterComm->setCallback([this](ActionMessage&& message) {
                BrokerBase::addActionMessage(std::move(message));
            });
            masterComm->setLoggingCallback(BrokerBase::getLoggingCallback());
            masterComm->setName(getIdentifier());
            masterComm->loadNetworkInfo(netInfo);
            masterComm->setTimeout(networkTimeout.to_ms());

            if (!masterComm->connect()) {
                return false;
            }
            BrokerFactory::addAssociatedBrokerType(getIdentifier(), type);
        }
        bool moreComms = (!configFile.empty());
        if (moreComms) {
            // remove options that are used to specify a broker
            app->remove_option(app->get_option("--broker"));
            app->remove_option(app->get_option("--brokerport"));
            app->remove_option(app->get_option("--brokername"));
            app->remove_option(app->get_option("--brokeraddress"));
            app->remove_option(app->get_option("--autobroker"));
        }
        uint16_t index = 0;
        while (moreComms) {
            netInfo = NetworkBrokerData();  // to reset the networkBrokerData
            app->get_config_formatter_base()->section("comms")->index(index);
            app->setDefaultCoreType(CoreType::MULTI);
            app->parse(localConfigString);
            type = app->getCoreType();
            if (type != CoreType::MULTI) {
                auto comm = CommFactory::create(type);
                comm->setCallback([this, index](ActionMessage&& message) {
                    if (message.action() == CMD_REG_BROKER) {
                        message.setExtraData(index + 1);
                    }
                    BrokerBase::addActionMessage(std::move(message));
                });
                comm->setLoggingCallback(BrokerBase::getLoggingCallback());
                comm->setName(getIdentifier());
                comm->loadNetworkInfo(netInfo);
                comm->setTimeout(networkTimeout.to_ms());

                const bool res = comm->connect();
                comms.push_back(std::move(comm));
                if (!res) {
                    brokerDisconnect();
                    return false;
                }
                BrokerFactory::addAssociatedBrokerType(getIdentifier(), type);
            } else {
                moreComms = false;
            }
            ++index;
        }
    }
    catch (const CLI::Error& e) {
        std::ostringstream oss;
        app->exit(e, oss, oss);
        sendToLogger(parent_broker_id, HELICS_LOG_LEVEL_ERROR, getIdentifier(), oss.str());
        brokerDisconnect();
        return false;
    }
    catch (...) {
        brokerDisconnect();
        return false;
    }
    return true;
}